

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_bitmap.c
# Opt level: O1

void ogl_draw_bitmap_region
               (ALLEGRO_BITMAP *bitmap,ALLEGRO_COLOR tint,float sx,float sy,float sw,float sh,
               int flags)

{
  int iVar1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _Bool _Var6;
  uint uVar7;
  ALLEGRO_BITMAP *bitmap_00;
  ALLEGRO_DISPLAY *pAVar8;
  ALLEGRO_TRANSFORM *pAVar9;
  float *x;
  bool bVar10;
  ALLEGRO_BITMAP *bitmap_01;
  uint uVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined4 in_XMM1_Dc;
  undefined4 uVar16;
  undefined4 in_XMM1_Dd;
  undefined4 uVar17;
  float fVar18;
  undefined4 in_XMM2_Db;
  float fVar19;
  undefined4 in_XMM3_Db;
  undefined1 auVar20 [16];
  undefined4 in_XMM4_Db;
  undefined4 in_XMM4_Dc;
  undefined4 in_XMM4_Dd;
  undefined4 in_XMM5_Db;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ALLEGRO_COLOR tint_00;
  float ytrans;
  float xtrans;
  undefined8 local_a8;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [16];
  float *local_48;
  undefined1 auVar15 [16];
  
  local_48 = tint._0_8_;
  local_68 = (float *)CONCAT44(in_XMM5_Db,sh);
  local_98 = (float *)CONCAT44(in_XMM4_Db,sw);
  local_78 = (float *)CONCAT44(in_XMM2_Db,sx);
  local_58._8_4_ = in_XMM1_Dc;
  local_58._0_8_ = tint._8_8_;
  local_58._12_4_ = in_XMM1_Dd;
  uStack_90 = in_XMM4_Dc;
  uStack_8c = in_XMM4_Dd;
  local_a8._0_4_ = sy;
  local_a8._4_4_ = in_XMM3_Db;
  bitmap_00 = al_get_target_bitmap();
  pAVar8 = _al_get_bitmap_display(bitmap_00);
  bitmap_01 = bitmap_00->parent;
  if (bitmap_00->parent == (ALLEGRO_BITMAP *)0x0) {
    bitmap_01 = bitmap_00;
  }
  pvVar2 = bitmap_01->extra;
  uVar7 = al_get_bitmap_flags(bitmap);
  fVar12 = (float)local_98;
  fVar13 = (float)local_68;
  uVar16 = local_98._4_4_;
  uVar17 = local_68._4_4_;
  if ((((uVar7 & 1) == 0) && (bitmap->locked == false)) && (bitmap_01->locked == false)) {
    bVar10 = true;
    if (*(char *)((long)bitmap->extra + 0x38) == '\x01') {
      local_88._4_4_ = (float)local_68;
      local_88._0_4_ = (float)local_98;
      uStack_80 = local_98._4_4_;
      uStack_7c = local_68._4_4_;
      pAVar9 = al_get_current_transform();
      _Var6 = _al_transform_is_translation(pAVar9,&xtrans,&ytrans);
      if (_Var6) {
        if (*(long *)((long)pvVar2 + 0x10) != 0) {
          _al_ogl_set_target_bitmap(pAVar8,bitmap);
        }
        fVar12 = (float)bitmap_01->cl;
        if (xtrans < fVar12) {
          local_78 = (float *)CONCAT44(local_78._4_4_,(float)local_78 - (xtrans - fVar12));
          local_98 = (float *)CONCAT44(local_98._4_4_,(float)local_98 + (xtrans - fVar12));
          xtrans = fVar12;
        }
        fVar13 = (float)bitmap_01->ct;
        fVar12 = (float)local_68;
        if (ytrans < fVar13) {
          local_a8._0_4_ = (float)local_a8 - (ytrans - fVar13);
          fVar12 = (float)local_68 + (ytrans - fVar13);
          ytrans = fVar13;
        }
        uVar7 = -(uint)((float)bitmap_01->cr_excl < (float)local_98 + xtrans);
        uVar11 = -(uint)((float)bitmap_01->cb_excl < fVar12 + ytrans);
        auVar20._0_4_ = ~uVar7 & (uint)(float)local_98;
        auVar20._4_4_ = ~uVar11 & (uint)fVar12;
        auVar20._8_4_ = ~-(uint)(0.0 < local_98._4_4_ + 0.0) & (uint)local_98._4_4_;
        auVar20._12_4_ = ~-(uint)(0.0 < local_68._4_4_ + 0.0) & (uint)local_68._4_4_;
        auVar22._4_4_ = (uint)((float)bitmap_01->cb_excl - ytrans) & uVar11;
        auVar22._0_4_ = (uint)((float)bitmap_01->cr_excl - xtrans) & uVar7;
        auVar22._8_8_ = 0;
        _local_88 = auVar20 | auVar22;
        uStack_90 = local_88._4_4_;
        local_98 = (float *)CONCAT44(uStack_90,uStack_90);
        uStack_8c = uStack_90;
        glBindTexture(0xde1,*(undefined4 *)((long)pvVar2 + 8));
        glCopyTexSubImage2D(0xde1,0,(int)xtrans,
                            (int)(((float)bitmap_01->h - ytrans) - (float)local_98),
                            (int)(float)local_78,
                            (int)(((float)bitmap->h - (float)local_a8) - (float)local_98),
                            (int)(float)local_88._0_4_,(int)(float)local_98);
        if (*(long *)((long)pvVar2 + 0x10) != 0) {
          _al_ogl_set_target_bitmap(pAVar8,bitmap_01);
        }
      }
      bVar10 = !_Var6;
      fVar12 = (float)local_88._0_4_;
      fVar13 = (float)local_88._4_4_;
      uVar16 = uStack_80;
      uVar17 = uStack_7c;
    }
    if (!bVar10) {
      return;
    }
  }
  auVar22 = local_58;
  if (pAVar8->ogl_extras->opengl_target == bitmap_01) {
    local_88._4_4_ = fVar13;
    local_88._0_4_ = fVar12;
    uStack_80 = uVar16;
    uStack_7c = uVar17;
    puVar3 = (undefined8 *)bitmap->extra;
    pAVar8 = al_get_current_display();
    if ((pAVar8->num_cache_vertices != 0) && (pAVar8->cache_texture != (ulong)*(uint *)(puVar3 + 1))
       ) {
      (*pAVar8->vt->flush_vertex_cache)(pAVar8);
    }
    pAVar8->cache_texture = (ulong)*(uint *)(puVar3 + 1);
    x = (float *)(*pAVar8->vt->prepare_vertex_cache)(pAVar8,6);
    iVar1 = bitmap->h;
    auVar14._0_4_ = ((float)bitmap->w - (float)local_78) - (float)local_88._0_4_;
    fVar12 = *(float *)(puVar3 + 5);
    fVar13 = *(float *)((long)puVar3 + 0x34);
    *x = 0.0;
    x[1] = (float)local_88._4_4_;
    x[2] = 0.0;
    fVar18 = (float)(int)*puVar3;
    fVar19 = (float)(int)((ulong)*puVar3 >> 0x20);
    auVar21._4_4_ = ((float)iVar1 - (float)local_a8) - (float)local_88._4_4_;
    auVar21._0_4_ = (float)local_78;
    auVar21._8_4_ = local_78._4_4_;
    auVar21._12_4_ = 0;
    auVar4._4_4_ = fVar19;
    auVar4._0_4_ = fVar18;
    auVar4._8_8_ = 0;
    auVar22 = divps(auVar21,auVar4);
    fVar12 = auVar22._0_4_ + fVar12;
    fVar13 = auVar22._4_4_ + fVar13;
    *(float **)(x + 5) = local_48;
    *(undefined8 *)(x + 7) = local_58._0_8_;
    x[0xb] = 0.0;
    x[0xc] = fVar12;
    *(float **)(x + 0xe) = local_48;
    *(undefined8 *)(x + 0x10) = local_58._0_8_;
    x[0x14] = 0.0;
    x[0x16] = fVar13;
    *(float **)(x + 0x17) = local_48;
    *(undefined8 *)(x + 0x19) = local_58._0_8_;
    x[0x24] = (float)local_88._0_4_;
    auVar15._4_8_ = 0;
    auVar15._0_4_ = auVar14._0_4_;
    auVar15._12_4_ = local_a8._4_4_;
    auVar14._8_8_ = auVar15._8_8_;
    auVar14._4_4_ = (float)local_a8;
    auVar5._4_4_ = fVar19;
    auVar5._0_4_ = fVar18;
    auVar5._8_8_ = 0;
    auVar22 = divps(auVar14,auVar5);
    fVar18 = (float)((ulong)*(undefined8 *)((long)puVar3 + 0x2c) >> 0x20) - auVar22._0_4_;
    fVar19 = (float)*(undefined8 *)((long)puVar3 + 0x2c) - auVar22._4_4_;
    *(ulong *)(x + 3) = CONCAT44(fVar13,fVar12);
    x[9] = 0.0;
    x[10] = 0.0;
    x[0xd] = fVar19;
    x[0x12] = (float)local_88._0_4_;
    x[0x13] = (float)local_88._4_4_;
    x[0x15] = fVar18;
    x[0x25] = 0.0;
    x[0x26] = 0.0;
    *(ulong *)(x + 0x27) = CONCAT44(fVar19,fVar18);
    *(float **)(x + 0x29) = local_48;
    *(undefined8 *)(x + 0x2b) = local_58._0_8_;
    if (pAVar8->cache_enabled == true) {
      local_88 = (undefined1  [8])(x + 1);
      local_58._0_8_ = x + 0xb;
      local_78 = x + 0x14;
      local_a8 = x + 0x24;
      local_98 = x + 0x25;
      local_68 = x + 0x26;
      local_48 = x + 0x13;
      pAVar9 = al_get_current_transform();
      al_transform_coordinates_3d(pAVar9,x,(float *)local_88,x + 2);
      pAVar9 = al_get_current_transform();
      al_transform_coordinates_3d(pAVar9,x + 9,x + 10,(float *)local_58._0_8_);
      pAVar9 = al_get_current_transform();
      al_transform_coordinates_3d(pAVar9,x + 0x12,local_48,local_78);
      pAVar9 = al_get_current_transform();
      al_transform_coordinates_3d(pAVar9,local_a8,local_98,local_68);
    }
    x[0x23] = x[0x11];
    *(undefined8 *)(x + 0x1f) = *(undefined8 *)(x + 0xd);
    *(undefined8 *)(x + 0x21) = *(undefined8 *)(x + 0xf);
    *(undefined8 *)(x + 0x1b) = *(undefined8 *)(x + 9);
    *(undefined8 *)(x + 0x1d) = *(undefined8 *)(x + 0xb);
    x[0x35] = x[0x1a];
    x[0x31] = x[0x16];
    x[0x32] = x[0x17];
    x[0x33] = x[0x18];
    x[0x34] = x[0x19];
    *(undefined8 *)(x + 0x2d) = *(undefined8 *)(x + 0x12);
    *(undefined8 *)(x + 0x2f) = *(undefined8 *)(x + 0x14);
    if (pAVar8->cache_enabled == false) {
      (*pAVar8->vt->flush_vertex_cache)(pAVar8);
    }
  }
  else {
    tint_00.b = (float)local_58._0_4_;
    tint_00.a = (float)local_58._4_4_;
    tint_00._0_8_ = local_48;
    local_58 = auVar22;
    _al_draw_bitmap_region_memory
              (bitmap,tint_00,(int)(float)local_78,(int)(float)local_a8,(int)fVar12,(int)fVar13,0,0,
               flags);
  }
  return;
}

Assistant:

static void ogl_draw_bitmap_region(ALLEGRO_BITMAP *bitmap,
   ALLEGRO_COLOR tint, float sx, float sy,
   float sw, float sh, int flags)
{
   // FIXME: hack
   // FIXME: need format conversion if they don't match
   ALLEGRO_BITMAP *target = al_get_target_bitmap();
   ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_target;
   ALLEGRO_DISPLAY *disp = _al_get_bitmap_display(target);

   /* For sub-bitmaps */
   if (target->parent) {
      target = target->parent;
   }

   ogl_target = target->extra;

   if (!(al_get_bitmap_flags(bitmap) & ALLEGRO_MEMORY_BITMAP) && !bitmap->locked &&
         !target->locked) {
      ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_source = bitmap->extra;
      if (ogl_source->is_backbuffer) {
         /* Our source bitmap is the OpenGL backbuffer, the target
          * is an OpenGL texture.
          */
         float xtrans, ytrans;

         /* Source and target cannot both be the back-buffer. */
         ASSERT(!ogl_target->is_backbuffer);

         /* If we only translate, we can do this fast. */
         if (_al_transform_is_translation(al_get_current_transform(),
            &xtrans, &ytrans)) {
            /* In general, we can't modify the texture while it's
             * FBO bound - so we temporarily disable the FBO.
             */
            if (ogl_target->fbo_info)
               _al_ogl_set_target_bitmap(disp, bitmap);
            
            /* We need to do clipping because glCopyTexSubImage2D
             * fails otherwise.
             */
            if (xtrans < target->cl) {
               sx -= xtrans - target->cl;
               sw += xtrans - target->cl;
               xtrans = target->cl;
            }
            if (ytrans < target->ct) {
               sy -= ytrans - target->ct;
               sh += ytrans - target->ct;
               ytrans = target->ct;
            }
            if (xtrans + sw > target->cr_excl) {
               sw = target->cr_excl - xtrans;
            }
            if (ytrans + sh > target->cb_excl) {
               sh = target->cb_excl - ytrans;
            }

            /* Note: Allegro 5.0.0 does not support blending or
             * tinting if the source bitmap is the screen. So it is
             * correct to ignore them here.
             */

            glBindTexture(GL_TEXTURE_2D, ogl_target->texture);
            glCopyTexSubImage2D(GL_TEXTURE_2D, 0,
                xtrans, target->h - ytrans - sh,
                sx, bitmap->h - sy - sh,
                sw, sh);
            /* Fix up FBO again after the copy. */
            if (ogl_target->fbo_info)
               _al_ogl_set_target_bitmap(disp, target);
            return;
         }
         
         /* Drawing a deformed backbuffer is not supported. */
         ASSERT(0);
      }
   }
   if (disp->ogl_extras->opengl_target == target) {
      draw_quad(bitmap, tint, sx, sy, sw, sh, flags);
      return;
   }

   /* If all else fails, fall back to software implementation. */
   _al_draw_bitmap_region_memory(bitmap, tint, sx, sy, sw, sh, 0, 0, flags);
}